

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_context.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint7 uVar8;
  uint uVar9;
  uint uVar10;
  FILE *__s;
  ulong uVar11;
  uint64_t mask0;
  ulong uVar12;
  long lVar13;
  long lVar14;
  secp256k1_fe *psVar15;
  ulong uVar16;
  secp256k1_fe *extraout_RDX;
  secp256k1_fe *rzr;
  secp256k1_fe *rzr_00;
  uint64_t uVar17;
  secp256k1_fe *rzr_01;
  size_t keylen;
  size_t keylen_00;
  size_t keylen_01;
  size_t keylen_02;
  size_t outlen;
  size_t outlen_00;
  ulong uVar18;
  uint64_t uVar19;
  secp256k1_gej *psVar20;
  ulong uVar21;
  int iVar22;
  uint64_t mask1;
  secp256k1_ge *psVar23;
  ulong uVar24;
  uint64_t *puVar25;
  secp256k1_gej *psVar26;
  ulong uVar27;
  secp256k1_ge *psVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  int *piVar36;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  byte bVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  long lVar44;
  undefined1 auVar45 [16];
  long lVar46;
  secp256k1_fe h2;
  long lStack_366c0;
  void *pvStack_366b8;
  secp256k1_fe x88;
  secp256k1_fe x176;
  secp256k1_fe x22;
  undefined8 uStack_36600;
  secp256k1_fe x2;
  secp256k1_fe x3;
  secp256k1_fe sStack_36590;
  ulong uStack_36568;
  uint64_t uStack_36560;
  uint64_t uStack_36558;
  uint64_t uStack_36550;
  uint64_t uStack_36548;
  int iStack_36540;
  secp256k1_fe sStack_36538;
  secp256k1_fe x176_1;
  secp256k1_fe x44;
  secp256k1_fe x2_1;
  secp256k1_fe sStack_36480;
  secp256k1_fe sStack_36458;
  int iStack_36430;
  secp256k1_fe sStack_36428;
  uint64_t uStack_363f8;
  uint64_t uStack_363f0;
  uint64_t uStack_363e8;
  uint64_t uStack_363e0;
  void *pvStack_363d8;
  ulong uStack_363d0;
  ulong uStack_363c8;
  ulong uStack_363c0;
  ulong uStack_363b8;
  ulong uStack_363b0;
  ulong uStack_363a8;
  ulong uStack_363a0;
  ulong uStack_36398;
  ulong uStack_36390;
  ulong uStack_36388;
  ulong uStack_36380;
  ulong uStack_36378;
  ulong uStack_36370;
  ulong uStack_36368;
  ulong uStack_36360;
  ulong uStack_36358;
  ulong uStack_36350;
  ulong uStack_36348;
  ulong uStack_36340;
  secp256k1_fe sStack_36338;
  secp256k1_fe nums_x;
  ulong auStack_362e0 [4];
  secp256k1_fe sStack_362c0;
  uint64_t uStack_36298;
  uint64_t uStack_36290;
  uint64_t uStack_36288;
  uint64_t uStack_36280;
  ulong uStack_36278;
  ulong uStack_36270;
  ulong uStack_36268;
  ulong uStack_36260;
  uint64_t uStack_36258;
  uint64_t uStack_36250;
  uint64_t uStack_36248;
  uint64_t uStack_36240;
  undefined1 auStack_36230 [16];
  undefined1 auStack_36220 [16];
  ulong uStack_36210;
  uint64_t auStack_36208 [10];
  secp256k1_fe x6;
  uint64_t uStack_36190;
  secp256k1_gej sStack_36108;
  ulong uStack_36088;
  uint7 uStack_36080;
  byte bStack_36079;
  uint7 uStack_36078;
  byte bStack_36071;
  undefined4 uStack_36070;
  undefined2 uStack_3606c;
  undefined1 uStack_3606a;
  byte bStack_36069;
  secp256k1_fe s;
  int aiStack_36040 [2];
  secp256k1_ge nums_ge;
  uint32_t uStack_35fc0;
  secp256k1_ge prec [1024];
  
  bVar40 = 0;
  __s = fopen("src/ecmult_static_context.h","w");
  if (__s == (FILE *)0x0) {
    main_cold_2();
    iVar22 = -1;
  }
  else {
    fwrite("#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n",0x2a,1,__s);
    fwrite("#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n",0x2a,1,__s);
    fwrite("#include \"src/group.h\"\n",0x17,1,__s);
    fwrite("#define SC SECP256K1_GE_STORAGE_CONST\n",0x26,1,__s);
    fprintf(__s,"#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n",0x40,0x10);
    fwrite("   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n"
           ,0x87,1,__s);
    fwrite("#endif\n",7,1,__s);
    fwrite("static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n"
           ,0x6c,1,__s);
    pvStack_366b8 = malloc(0x10000);
    if (pvStack_366b8 == (void *)0x0) {
      main_cold_1();
    }
    auStack_36208[0] = 0x2815b16f81798;
    auStack_36208[1] = 0xdb2dce28d959f;
    auStack_36208[2] = 0xe870b07029bfc;
    auStack_36208[3] = 0xbbac55a06295c;
    auStack_36208[4] = 0x79be667ef9dc;
    auStack_36208[5] = 0x7d08ffb10d4b8;
    auStack_36208[6] = 0x48a68554199c4;
    auStack_36208[7] = 0xe1108a8fd17b4;
    auStack_36208[8] = 0xc4655da4fbfc0;
    auStack_36208[9] = 0x483ada7726a3;
    uStack_36258 = 0;
    uStack_36250 = 0;
    uStack_36248 = 0;
    uStack_36240 = 0;
    pvStack_363d8 = pvStack_366b8;
    secp256k1_fe_set_b32(&nums_x,(uchar *)"The scalar for this x is unknown");
    nums_ge.x.n[0] = nums_x.n[0];
    nums_ge.x.n[1] = nums_x.n[1];
    nums_ge.x.n[2] = nums_x.n[2];
    nums_ge.x.n[3] = nums_x.n[3];
    nums_ge.x.n[4] = nums_x.n[4];
    secp256k1_fe_sqr(&x2,&nums_x);
    secp256k1_fe_mul(&h2,&nums_x,&x2);
    nums_ge._80_8_ = (ulong)(uint)nums_ge._84_4_ << 0x20;
    h2.n[0] = h2.n[0] + 7;
    secp256k1_fe_sqr(&x2_1,&h2);
    secp256k1_fe_mul(&x2_1,&x2_1,&h2);
    secp256k1_fe_sqr(&x3,&x2_1);
    secp256k1_fe_mul(&x3,&x3,&h2);
    uStack_36190 = x6.n[4];
    x6.n[4] = x3.n[4];
    x6.n[3] = x3.n[3];
    x6.n[2] = x3.n[2];
    x6.n[1] = x3.n[1];
    x6.n[0] = x3.n[0];
    iVar22 = 3;
    do {
      secp256k1_fe_sqr(&x6,&x6);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x6,&x6,&x3);
    iVar22 = 3;
    do {
      secp256k1_fe_sqr(&x6,&x6);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x6,&x6,&x3);
    secp256k1_fe_sqr(&x6,&x6);
    secp256k1_fe_sqr(&x6,&x6);
    secp256k1_fe_mul(&x6,&x6,&x2_1);
    x22.n[4] = x6.n[4];
    x22.n[2] = x6.n[2];
    x22.n[3] = x6.n[3];
    x22.n[0] = x6.n[0];
    x22.n[1] = x6.n[1];
    iVar22 = 0xb;
    do {
      secp256k1_fe_sqr(&x22,&x22);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x22,&x22,&x6);
    x44.n[4] = x22.n[4];
    x44.n[2] = x22.n[2];
    x44.n[3] = x22.n[3];
    x44.n[0] = x22.n[0];
    x44.n[1] = x22.n[1];
    iVar22 = 0x16;
    do {
      secp256k1_fe_sqr(&x44,&x44);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x44,&x44,&x22);
    x88.n[4] = x44.n[4];
    x88.n[2] = x44.n[2];
    x88.n[3] = x44.n[3];
    x88.n[0] = x44.n[0];
    x88.n[1] = x44.n[1];
    iVar22 = 0x2c;
    do {
      secp256k1_fe_sqr(&x88,&x88);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x88,&x88,&x44);
    x176.n[4] = x88.n[4];
    x176.n[2] = x88.n[2];
    x176.n[3] = x88.n[3];
    x176.n[0] = x88.n[0];
    x176.n[1] = x88.n[1];
    iVar22 = 0x58;
    do {
      secp256k1_fe_sqr(&x176,&x176);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x176,&x176,&x88);
    iVar22 = 0x2c;
    do {
      secp256k1_fe_sqr(&x176,&x176);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x176,&x176,&x44);
    iVar22 = 3;
    do {
      secp256k1_fe_sqr(&x176,&x176);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x176,&x176,&x3);
    iVar22 = 0x17;
    do {
      secp256k1_fe_sqr(&x176,&x176);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x176,&x176,&x22);
    iVar22 = 6;
    do {
      secp256k1_fe_sqr(&x176,&x176);
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
    secp256k1_fe_mul(&x176,&x176,&x2_1);
    secp256k1_fe_sqr(&x176,&x176);
    secp256k1_fe_sqr(&nums_ge.y,&x176);
    secp256k1_fe_sqr(&x176,&nums_ge.y);
    iVar22 = secp256k1_fe_normalizes_to_zero(&prec[0].x);
    if (iVar22 != 0) {
      uVar11 = (nums_ge.y.n[4] >> 0x30) * 0x1000003d1 + nums_ge.y.n[0];
      uVar12 = (uVar11 >> 0x34) + nums_ge.y.n[1];
      nums_ge.y.n[0] = uVar11 & 0xfffffffffffff;
      uVar11 = (uVar12 >> 0x34) + nums_ge.y.n[2];
      uVar24 = (uVar11 >> 0x34) + nums_ge.y.n[3];
      nums_ge.y.n[2] = uVar11 & 0xfffffffffffff;
      nums_ge.y.n[1] = uVar12 & 0xfffffffffffff;
      nums_ge.y.n[4] = (uVar24 >> 0x34) + (nums_ge.y.n[4] & 0xffffffffffff);
      nums_ge.y.n[3] = uVar24 & 0xfffffffffffff;
      if (0xffffefffffc2e < nums_ge.y.n[0] &&
          ((nums_ge.y.n[2] & uVar12 & uVar24) == 0xfffffffffffff && nums_ge.y.n[4] == 0xffffffffffff
          ) || nums_ge.y.n[4] >> 0x30 != 0) {
        uVar11 = nums_ge.y.n[1] + (nums_ge.y.n[0] + 0x1000003d1 >> 0x34);
        nums_ge.y.n[0] = nums_ge.y.n[0] + 0x1000003d1 & 0xfffffffffffff;
        uVar12 = nums_ge.y.n[2] + (uVar11 >> 0x34);
        nums_ge.y.n[1] = uVar11 & 0xfffffffffffff;
        uVar11 = nums_ge.y.n[3] + (uVar12 >> 0x34);
        nums_ge.y.n[2] = uVar12 & 0xfffffffffffff;
        nums_ge.y.n[3] = uVar11 & 0xfffffffffffff;
        nums_ge.y.n[4] = (uVar11 >> 0x34) + nums_ge.y.n[4] & 0xffffffffffff;
      }
      if ((nums_ge.y.n[0] & 1) != 0) {
        nums_ge.y.n[0] = 0x3ffffbfffff0bc - nums_ge.y.n[0];
        nums_ge.y.n[1] = 0x3ffffffffffffc - nums_ge.y.n[1];
        nums_ge.y.n[2] = 0x3ffffffffffffc - nums_ge.y.n[2];
        nums_ge.y.n[3] = 0x3ffffffffffffc - nums_ge.y.n[3];
        nums_ge.y.n[4] = 0x3fffffffffffc - nums_ge.y.n[4];
      }
    }
    x2_1.n[0] = nums_ge.x.n[0];
    x2_1.n[1] = nums_ge.x.n[1];
    x2_1.n[2] = nums_ge.x.n[2];
    x2_1.n[3] = nums_ge.x.n[3];
    x2_1.n[4] = nums_ge.x.n[4];
    sStack_36480.n[0] = nums_ge.y.n[0];
    sStack_36480.n[1] = nums_ge.y.n[1];
    sStack_36480.n[2] = nums_ge.y.n[2];
    sStack_36480.n[3] = nums_ge.y.n[3];
    sStack_36480.n[4] = nums_ge.y.n[4];
    sStack_36458.n[0] = 1;
    sStack_36458.n[1] = 0;
    sStack_36458.n[2] = 0;
    sStack_36458.n[3] = 0;
    sStack_36458.n[4] = 0;
    iStack_36430 = 0;
    if (nums_ge.infinity == 0) {
      secp256k1_fe_sqr(&prec[0].x,&sStack_36458);
      uVar27 = (nums_ge.x.n[4] >> 0x30) * 0x1000003d1 + nums_ge.x.n[0];
      uVar11 = (uVar27 >> 0x34) + nums_ge.x.n[1];
      uVar24 = (uVar11 >> 0x34) + nums_ge.x.n[2];
      uVar27 = uVar27 & 0xfffffffffffff;
      uVar11 = uVar11 & 0xfffffffffffff;
      uVar12 = (uVar24 >> 0x34) + nums_ge.x.n[3];
      uVar24 = uVar24 & 0xfffffffffffff;
      uVar17 = (uVar12 >> 0x34) + (nums_ge.x.n[4] & 0xffffffffffff);
      uVar12 = uVar12 & 0xfffffffffffff;
      x3.n[0] = uVar27;
      x3.n[1] = uVar11;
      x3.n[2] = uVar24;
      x3.n[3] = uVar12;
      x3.n[4] = uVar17;
      secp256k1_fe_mul(&x6,&secp256k1_ge_const_g.x,&prec[0].x);
      uVar32 = (nums_ge.y.n[4] >> 0x30) * 0x1000003d1 + nums_ge.y.n[0];
      uVar33 = (uVar32 >> 0x34) + nums_ge.y.n[1];
      uVar29 = (uVar33 >> 0x34) + nums_ge.y.n[2];
      uVar32 = uVar32 & 0xfffffffffffff;
      uVar33 = uVar33 & 0xfffffffffffff;
      uVar30 = (uVar29 >> 0x34) + nums_ge.y.n[3];
      uVar29 = uVar29 & 0xfffffffffffff;
      lVar13 = (uVar30 >> 0x34) + (nums_ge.y.n[4] & 0xffffffffffff);
      uVar30 = uVar30 & 0xfffffffffffff;
      x22.n[4] = lVar13;
      x22.n[0] = uVar32;
      x22.n[1] = uVar33;
      x22.n[2] = uVar29;
      x22.n[3] = uVar30;
      secp256k1_fe_mul(&x44,&secp256k1_ge_const_g.y,&prec[0].x);
      secp256k1_fe_mul(&x44,&x44,&sStack_36458);
      x88.n[0] = (x6.n[0] - uVar27) + 0x3ffffbfffff0bc;
      x88.n[1] = (x6.n[1] - uVar11) + 0x3ffffffffffffc;
      x88.n[2] = (x6.n[2] - uVar24) + 0x3ffffffffffffc;
      x176.n[0] = (x44.n[0] - uVar32) + 0x3ffffbfffff0bc;
      x176.n[1] = (x44.n[1] - uVar33) + 0x3ffffffffffffc;
      x176.n[2] = (x44.n[2] - uVar29) + 0x3ffffffffffffc;
      x88.n[3] = (x6.n[3] - uVar12) + 0x3ffffffffffffc;
      x88.n[4] = (x6.n[4] - uVar17) + 0x3fffffffffffc;
      x176.n[3] = (x44.n[3] - uVar30) + 0x3ffffffffffffc;
      x176.n[4] = (x44.n[4] - lVar13) + 0x3fffffffffffc;
      iVar22 = secp256k1_fe_normalizes_to_zero_var(&x88);
      if (iVar22 == 0) {
        secp256k1_fe_sqr(&x2,&x176);
        secp256k1_fe_sqr(&h2,&x88);
        secp256k1_fe_mul(&x176_1,&x88,&h2);
        secp256k1_fe_mul(&sStack_36458,&sStack_36458,&x88);
        secp256k1_fe_mul(&sStack_36538,&x3,&h2);
        lVar44 = x2.n[0] - (sStack_36538.n[0] * 2 + x176_1.n[0]);
        lVar46 = x2.n[1] - (sStack_36538.n[1] * 2 + x176_1.n[1]);
        x2_1.n[0] = lVar44 + 0x7ffff7ffffe178;
        x2_1.n[1] = lVar46 + 0x7ffffffffffff8;
        lVar14 = x2.n[2] - (sStack_36538.n[2] * 2 + x176_1.n[2]);
        lVar37 = x2.n[3] - (sStack_36538.n[3] * 2 + x176_1.n[3]);
        x2_1.n[2] = lVar14 + 0x7ffffffffffff8;
        x2_1.n[3] = lVar37 + 0x7ffffffffffff8;
        lVar13 = x2.n[4] - (sStack_36538.n[4] * 2 + x176_1.n[4]);
        x2_1.n[4] = lVar13 + 0x7fffffffffff8;
        sStack_36480.n[0] = (sStack_36538.n[0] - lVar44) + 0x3ffffbfffff0bc;
        sStack_36480.n[1] = (sStack_36538.n[1] - lVar46) + 0x3ffffffffffffc;
        sStack_36480.n[2] = (sStack_36538.n[2] - lVar14) + 0x3ffffffffffffc;
        sStack_36480.n[3] = (sStack_36538.n[3] - lVar37) + 0x3ffffffffffffc;
        sStack_36480.n[4] = (sStack_36538.n[4] - lVar13) + 0x3fffffffffffc;
        secp256k1_fe_mul(&sStack_36480,&sStack_36480,&x176);
        secp256k1_fe_mul(&x176_1,&x176_1,&x22);
        sStack_36480.n[0] = (sStack_36480.n[0] - x176_1.n[0]) + 0x3ffffbfffff0bc;
        sStack_36480.n[1] = (sStack_36480.n[1] - x176_1.n[1]) + 0x3ffffffffffffc;
        sStack_36480.n[2] = (sStack_36480.n[2] - x176_1.n[2]) + 0x3ffffffffffffc;
        sStack_36480.n[3] = (sStack_36480.n[3] - x176_1.n[3]) + 0x3ffffffffffffc;
        sStack_36480.n[4] = (sStack_36480.n[4] - x176_1.n[4]) + 0x3fffffffffffc;
      }
      else {
        iVar22 = secp256k1_fe_normalizes_to_zero_var(&x176);
        if (iVar22 == 0) {
          iStack_36430 = 1;
          x2_1.n[0] = 0;
          x2_1.n[1] = 0;
          x2_1.n[2] = 0;
          x2_1.n[3] = 0;
          x2_1.n[4] = 0;
          sStack_36480.n[0] = 0;
          sStack_36480.n[1] = 0;
          sStack_36480.n[2] = 0;
          sStack_36480.n[3] = 0;
          sStack_36480.n[4] = 0;
          sStack_36458.n[0] = 0;
          sStack_36458.n[1] = 0;
          sStack_36458.n[2] = 0;
          sStack_36458.n[3] = 0;
          sStack_36458.n[4] = 0;
        }
        else {
          secp256k1_gej_double_var((secp256k1_gej *)&x2_1,(secp256k1_gej *)&x2_1,rzr_01);
        }
      }
    }
    else {
      x2_1.n[2] = 0xe870b07029bfc;
      x2_1.n[3] = 0xbbac55a06295c;
      x2_1.n[0] = 0x2815b16f81798;
      x2_1.n[1] = 0xdb2dce28d959f;
      x2_1.n[4] = 0x79be667ef9dc;
      sStack_36480.n[0] = 0x7d08ffb10d4b8;
      sStack_36480.n[1] = 0x48a68554199c4;
      sStack_36480.n[2] = 0xe1108a8fd17b4;
      sStack_36480.n[3] = 0xc4655da4fbfc0;
      sStack_36480.n[4] = 0x483ada7726a3;
      sStack_36458.n[0] = 1;
      sStack_36458.n[3] = 0;
      sStack_36458.n[4] = 0;
      sStack_36458.n[1] = 0;
      sStack_36458.n[2] = 0;
    }
    puVar25 = auStack_36208;
    psVar20 = (secp256k1_gej *)&x3;
    for (lVar13 = 10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (psVar20->x).n[0] = *puVar25;
      puVar25 = puVar25 + (ulong)bVar40 * -2 + 1;
      psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar40 * -0x10 + 8);
    }
    uStack_36568 = 1;
    uStack_36560 = uStack_36258;
    uStack_36558 = uStack_36250;
    uStack_36550 = uStack_36248;
    uStack_36548 = uStack_36240;
    iStack_36540 = 0;
    psVar15 = &x2_1;
    psVar20 = (secp256k1_gej *)&x6;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (psVar20->x).n[0] = psVar15->n[0];
      psVar15 = (secp256k1_fe *)((long)psVar15 + ((ulong)bVar40 * -2 + 1) * 8);
      psVar20 = (secp256k1_gej *)((long)psVar20 + (ulong)bVar40 * -0x10 + 8);
    }
    psVar20 = (secp256k1_gej *)&nums_ge;
    lVar13 = 0;
    do {
      psVar26 = (secp256k1_gej *)&x6;
      puVar25 = (uint64_t *)((long)&nums_ge + lVar13 * 0x800);
      for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
        *puVar25 = (psVar26->x).n[0];
        psVar26 = (secp256k1_gej *)((long)psVar26 + (ulong)bVar40 * -0x10 + 8);
        puVar25 = puVar25 + (ulong)bVar40 * -2 + 1;
      }
      lVar14 = 0xf;
      psVar15 = (secp256k1_fe *)0x0;
      psVar26 = psVar20;
      do {
        secp256k1_gej_add_var(psVar26 + 1,psVar26,(secp256k1_gej *)&x3,psVar15);
        lVar14 = lVar14 + -1;
        psVar26 = psVar26 + 1;
      } while (lVar14 != 0);
      iVar22 = 4;
      rzr = extraout_RDX;
      do {
        secp256k1_gej_double_var((secp256k1_gej *)&x3,(secp256k1_gej *)&x3,rzr);
        iVar22 = iVar22 + -1;
        rzr = rzr_00;
      } while (iVar22 != 0);
      secp256k1_gej_double_var((secp256k1_gej *)&x6,(secp256k1_gej *)&x6,rzr_00);
      if (lVar13 == 0x3e) {
        secp256k1_gej_neg((secp256k1_gej *)&x6,(secp256k1_gej *)&x6);
        secp256k1_gej_add_var
                  ((secp256k1_gej *)&x6,(secp256k1_gej *)&x6,(secp256k1_gej *)&x2_1,psVar15);
      }
      lVar13 = lVar13 + 1;
      psVar20 = psVar20 + 0x10;
    } while (lVar13 != 0x40);
    lVar13 = -1;
    piVar36 = &nums_ge.infinity;
    lVar14 = 0;
    psVar28 = prec;
    do {
      if (piVar36[10] == 0) {
        if (lVar13 == -1) {
          (psVar28->x).n[4] = *(uint64_t *)(piVar36 + 8);
          uVar19 = *(uint64_t *)piVar36;
          uVar5 = *(uint64_t *)(piVar36 + 2);
          uVar17 = *(uint64_t *)(piVar36 + 6);
          (psVar28->x).n[2] = *(uint64_t *)(piVar36 + 4);
          (psVar28->x).n[3] = uVar17;
          (psVar28->x).n[0] = uVar19;
          (psVar28->x).n[1] = uVar5;
          lVar13 = lVar14;
        }
        else {
          secp256k1_fe_mul(&psVar28->x,&prec[lVar13].x,(secp256k1_fe *)piVar36);
          lVar13 = lVar14;
        }
      }
      lVar14 = lVar14 + 1;
      psVar28 = psVar28 + 1;
      piVar36 = piVar36 + 0x20;
    } while (lVar14 != 0x400);
    if (lVar13 != -1) {
      psVar28 = prec + lVar13;
      secp256k1_fe_sqr(&x22,&psVar28->x);
      secp256k1_fe_mul(&x22,&x22,&psVar28->x);
      secp256k1_fe_sqr(&x44,&x22);
      secp256k1_fe_mul(&x44,&x44,&psVar28->x);
      x88.n[4] = x44.n[4];
      x88.n[2] = x44.n[2];
      x88.n[3] = x44.n[3];
      x88.n[0] = x44.n[0];
      x88.n[1] = x44.n[1];
      iVar22 = 3;
      do {
        secp256k1_fe_sqr(&x88,&x88);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x88,&x88,&x44);
      iVar22 = 3;
      do {
        secp256k1_fe_sqr(&x88,&x88);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x88,&x88,&x44);
      secp256k1_fe_sqr(&x88,&x88);
      secp256k1_fe_sqr(&x88,&x88);
      secp256k1_fe_mul(&x88,&x88,&x22);
      x176.n[4] = x88.n[4];
      x176.n[2] = x88.n[2];
      x176.n[3] = x88.n[3];
      x176.n[0] = x88.n[0];
      x176.n[1] = x88.n[1];
      iVar22 = 0xb;
      do {
        secp256k1_fe_sqr(&x176,&x176);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176,&x176,&x88);
      x2.n[4] = x176.n[4];
      x2.n[2] = x176.n[2];
      x2.n[3] = x176.n[3];
      x2.n[0] = x176.n[0];
      x2.n[1] = x176.n[1];
      iVar22 = 0x16;
      do {
        secp256k1_fe_sqr(&x2,&x2);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x2,&x2,&x176);
      h2.n[4] = x2.n[4];
      h2.n[2] = x2.n[2];
      h2.n[3] = x2.n[3];
      h2.n[0] = x2.n[0];
      h2.n[1] = x2.n[1];
      iVar22 = 0x2c;
      do {
        secp256k1_fe_sqr(&h2,&h2);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&h2,&h2,&x2);
      x176_1.n[4] = h2.n[4];
      x176_1.n[2] = h2.n[2];
      x176_1.n[3] = h2.n[3];
      x176_1.n[0] = h2.n[0];
      x176_1.n[1] = h2.n[1];
      iVar22 = 0x58;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&h2);
      iVar22 = 0x2c;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&x2);
      iVar22 = 3;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&x44);
      iVar22 = 0x17;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&x176);
      iVar22 = 5;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&psVar28->x);
      iVar22 = 3;
      do {
        secp256k1_fe_sqr(&x176_1,&x176_1);
        iVar22 = iVar22 + -1;
      } while (iVar22 != 0);
      secp256k1_fe_mul(&x176_1,&x176_1,&x22);
      secp256k1_fe_sqr(&x176_1,&x176_1);
      secp256k1_fe_sqr(&x176_1,&x176_1);
      secp256k1_fe_mul(&sStack_36538,&psVar28->x,&x176_1);
      if (lVar13 == 0) {
        lVar13 = 0;
      }
      else {
        psVar28 = prec + lVar13 + -1;
        piVar36 = aiStack_36040 + lVar13 * 0x20;
        lVar14 = lVar13;
        do {
          lVar14 = lVar14 + -1;
          if (*piVar36 == 0) {
            secp256k1_fe_mul(&prec[lVar13].x,&psVar28->x,&sStack_36538);
            secp256k1_fe_mul(&sStack_36538,&sStack_36538,
                             (secp256k1_fe *)((long)&nums_ge + lVar13 * 0x80 + 0x50));
            lVar13 = lVar14;
          }
          psVar28 = psVar28 + -1;
          piVar36 = piVar36 + -0x20;
        } while (lVar14 != 0);
      }
      prec[lVar13].x.n[4] = sStack_36538.n[4];
      prec[lVar13].x.n[2] = sStack_36538.n[2];
      prec[lVar13].x.n[3] = sStack_36538.n[3];
      prec[lVar13].x.n[0] = sStack_36538.n[0];
      prec[lVar13].x.n[1] = sStack_36538.n[1];
      psVar28 = &nums_ge;
      lVar13 = 0;
      do {
        iVar22 = (int)psVar28[1].x.n[4];
        *(int *)((long)(&prec[0].y + 1) + lVar13) = iVar22;
        if (iVar22 == 0) {
          psVar15 = (secp256k1_fe *)((long)prec[0].x.n + lVar13);
          secp256k1_fe_sqr(&x22,psVar15);
          secp256k1_fe_mul(&x44,&x22,psVar15);
          secp256k1_fe_mul(psVar15,&psVar28->x,&x22);
          secp256k1_fe_mul((secp256k1_fe *)((long)prec[0].y.n + lVar13),&psVar28->y,&x44);
          *(undefined4 *)((long)(&prec[0].y + 1) + lVar13) = 0;
        }
        lVar13 = lVar13 + 0x58;
        psVar28 = (secp256k1_ge *)&psVar28[1].y;
      } while (lVar13 != 0x16000);
    }
    lVar14 = (long)pvStack_366b8 + 0x38;
    psVar28 = prec;
    lVar13 = 0;
    do {
      lVar37 = 0;
      psVar23 = psVar28;
      do {
        nums_ge.x.n[0] = (psVar23->x).n[0];
        nums_ge.x.n[1] = (psVar23->x).n[1];
        nums_ge.x.n[2] = (psVar23->x).n[2];
        nums_ge.x.n[3] = (psVar23->x).n[3];
        nums_ge.x.n[4] = (psVar23->x).n[4];
        secp256k1_fe_normalize(&nums_ge.x);
        x3.n[4] = (psVar23->y).n[4];
        x3.n[0] = (psVar23->y).n[0];
        x3.n[1] = (psVar23->y).n[1];
        x3.n[2] = (psVar23->y).n[2];
        x3.n[3] = (psVar23->y).n[3];
        secp256k1_fe_normalize(&x3);
        *(uint64_t *)(lVar14 + -0x38 + lVar37) = nums_ge.x.n[1] << 0x34 | nums_ge.x.n[0];
        *(uint64_t *)(lVar14 + -0x30 + lVar37) = nums_ge.x.n[2] << 0x28 | nums_ge.x.n[1] >> 0xc;
        *(uint64_t *)(lVar14 + -0x28 + lVar37) = nums_ge.x.n[3] << 0x1c | nums_ge.x.n[2] >> 0x18;
        *(uint64_t *)(lVar14 + -0x20 + lVar37) = nums_ge.x.n[4] << 0x10 | nums_ge.x.n[3] >> 0x24;
        *(uint64_t *)(lVar14 + -0x18 + lVar37) = x3.n[1] << 0x34 | x3.n[0];
        *(uint64_t *)(lVar14 + -0x10 + lVar37) = x3.n[2] << 0x28 | x3.n[1] >> 0xc;
        *(uint64_t *)(lVar14 + -8 + lVar37) = x3.n[3] << 0x1c | x3.n[2] >> 0x18;
        *(uint64_t *)(lVar14 + lVar37) = x3.n[4] << 0x10 | x3.n[3] >> 0x24;
        lVar37 = lVar37 + 0x40;
        psVar23 = psVar23 + 1;
      } while (lVar37 != 0x400);
      lVar13 = lVar13 + 1;
      psVar28 = psVar28 + 0x10;
      lVar14 = lVar14 + 0x400;
    } while (lVar13 != 0x40);
    sStack_36108.infinity = 0;
    sStack_36108.x.n[0] = 0x2815b16f81798;
    sStack_36108.x.n[1] = 0xdb2dce28d959f;
    sStack_36108.x.n[2] = 0xe870b07029bfc;
    sStack_36108.x.n[3] = 0xbbac55a06295c;
    sStack_36108.x.n[4] = 0x79be667ef9dc;
    sStack_36108.y.n[0] = 0x7d08ffb10d4b8;
    sStack_36108.y.n[1] = 0x48a68554199c4;
    sStack_36108.y.n[2] = 0xe1108a8fd17b4;
    sStack_36108.y.n[3] = 0xc4655da4fbfc0;
    sStack_36108.y.n[4] = 0x483ada7726a3;
    sStack_36108.z.n[0] = 1;
    sStack_36108.z.n[1] = 0;
    sStack_36108.z.n[2] = 0;
    sStack_36108.z.n[3] = 0;
    sStack_36108.z.n[4] = 0;
    secp256k1_gej_neg(&sStack_36108,&sStack_36108);
    uStack_36088 = 0;
    uStack_36080 = 0;
    bStack_36079 = 0;
    uStack_36078 = 0;
    bStack_36071 = 0;
    uStack_36070 = 0;
    uStack_3606c = 0;
    uStack_3606a = 0;
    bStack_36069 = 1;
    stack0xfffffffffffc99f8 = ZEXT816(0);
    x22.n._0_16_ = ZEXT816(0) << 0x40;
    x22.n._16_12_ = ZEXT812(0);
    x22.n[3]._4_3_ = 0;
    x22.n[3]._7_1_ = 1;
    puVar25 = x6.n + 4;
    x6.n[1] = 0x101010101010101;
    x6.n[0] = 0x101010101010101;
    x6.n[3] = 0x101010101010101;
    x6.n[2] = 0x101010101010101;
    stack0xfffffffffffc9e68 = (undefined1  [16])0x0;
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25,keylen);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,"",1);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x22,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25,keylen_00);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)&x6);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25,keylen_01);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,"\x01",1);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x22,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25);
    secp256k1_hmac_sha256_initialize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)puVar25,keylen_02);
    secp256k1_sha256_write((secp256k1_sha256 *)&nums_ge,(uchar *)&x6,0x20);
    secp256k1_hmac_sha256_finalize((secp256k1_hmac_sha256 *)&nums_ge,(uchar *)&x6);
    x22.n[0] = 0;
    x22.n[1] = 0;
    x22.n[2] = 0;
    x22.n[3] = 0;
    stack0xfffffffffffc99f8 = (undefined1  [16])0x0;
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)&x6,(uchar *)&uStack_36088,outlen);
    uVar9 = secp256k1_fe_set_b32(&s,(uchar *)&uStack_36088);
    uVar12 = (ulong)((uint)(((s.n[2] == 0 && s.n[3] == 0) && (s.n[1] == 0 && s.n[0] == 0)) &&
                           s.n[4] == 0) | uVar9 ^ 1);
    uVar11 = uVar12 - 1;
    s.n[1] = s.n[1] & uVar11;
    s.n[0] = s.n[0] & uVar11 | uVar12;
    s.n[3] = s.n[3] & uVar11;
    s.n[2] = s.n[2] & uVar11;
    s.n[4] = uVar11 & s.n[4];
    secp256k1_fe_sqr(&nums_ge.x,&s);
    secp256k1_fe_mul(&sStack_36108.x,&sStack_36108.x,&nums_ge.x);
    psVar15 = &sStack_36108.y;
    secp256k1_fe_mul(psVar15,psVar15,&nums_ge.x);
    secp256k1_fe_mul(psVar15,psVar15,&s);
    secp256k1_fe_mul(&sStack_36108.z,&sStack_36108.z,&s);
    s.n[0] = 0;
    s.n[1] = 0;
    s.n[2] = 0;
    s.n[3] = 0;
    s.n[4] = 0;
    secp256k1_rfc6979_hmac_sha256_generate
              ((secp256k1_rfc6979_hmac_sha256 *)&x6,(uchar *)&uStack_36088,outlen_00);
    uVar8 = CONCAT16(uStack_3606a,CONCAT24(uStack_3606c,uStack_36070));
    uVar12 = (ulong)bStack_36069 | ((ulong)uVar8 & 0xff000000000000) >> 0x28 |
             ((ulong)uVar8 & 0xff0000000000) >> 0x18 | ((ulong)uVar8 & 0xff00000000) >> 8 |
             ((ulong)uVar8 & 0xff000000) << 8 | ((ulong)uVar8 & 0xff0000) << 0x18 |
             ((ulong)uVar8 & 0xff00) << 0x28 | CONCAT17(bStack_36069,uVar8) << 0x38;
    uVar27 = (ulong)bStack_36071 | ((ulong)uStack_36078 & 0xff000000000000) >> 0x28 |
             ((ulong)uStack_36078 & 0xff0000000000) >> 0x18 |
             ((ulong)uStack_36078 & 0xff00000000) >> 8 | ((ulong)uStack_36078 & 0xff000000) << 8 |
             ((ulong)uStack_36078 & 0xff0000) << 0x18 | ((ulong)uStack_36078 & 0xff00) << 0x28 |
             CONCAT17(bStack_36071,uStack_36078) << 0x38;
    uVar24 = (ulong)bStack_36079 | ((ulong)uStack_36080 & 0xff000000000000) >> 0x28 |
             ((ulong)uStack_36080 & 0xff0000000000) >> 0x18 |
             ((ulong)uStack_36080 & 0xff00000000) >> 8 | ((ulong)uStack_36080 & 0xff000000) << 8 |
             ((ulong)uStack_36080 & 0xff0000) << 0x18 | ((ulong)uStack_36080 & 0xff00) << 0x28 |
             CONCAT17(bStack_36079,uStack_36080) << 0x38;
    uVar11 = uStack_36088 >> 0x38 | (uStack_36088 & 0xff000000000000) >> 0x28 |
             (uStack_36088 & 0xff0000000000) >> 0x18 | (uStack_36088 & 0xff00000000) >> 8 |
             (uStack_36088 & 0xff000000) << 8 | (uStack_36088 & 0xff0000) << 0x18 |
             (uStack_36088 & 0xff00) << 0x28 | uStack_36088 << 0x38;
    uVar10 = (uint)((0xfffffffffffffffd < uVar24 && uVar11 == 0xffffffffffffffff) &&
                   0xbaaedce6af48a03a < uVar27);
    uVar9 = 0;
    if (0xbaaedce6af48a03b < uVar27) {
      uVar9 = uVar10;
    }
    if (uVar12 < 0xbfd25e8cd0364141) {
      uVar10 = 0;
    }
    uVar33 = (ulong)(uVar10 | uVar9 | (uVar24 == 0xffffffffffffffff && uVar11 == 0xffffffffffffffff)
                    );
    uVar29 = uVar33 * 0x402da1732fc9bebf + uVar12;
    uVar12 = (ulong)CARRY8(uVar33 * 0x402da1732fc9bebf,uVar12);
    uVar30 = uVar33 * 0x4551231950b75fc4 + uVar27;
    uVar32 = uVar30 + uVar12;
    uVar12 = (ulong)(CARRY8(uVar33 * 0x4551231950b75fc4,uVar27) || CARRY8(uVar30,uVar12));
    uVar27 = uVar24 + uVar33 + uVar12;
    uVar11 = uVar11 + (CARRY8(uVar24,uVar33) || CARRY8(uVar24 + uVar33,uVar12));
    bVar3 = uVar29 == 0;
    bVar4 = uVar32 == 0;
    bVar2 = uVar27 == 0;
    bVar1 = uVar11 == 0;
    if (((bVar3 && bVar4) && bVar2) && bVar1) {
      uVar29 = 0;
    }
    if (((bVar3 && bVar4) && bVar2) && bVar1) {
      uVar32 = 0;
    }
    if (((bVar3 && bVar4) && bVar2) && bVar1) {
      uVar27 = 0;
    }
    uVar29 = uVar29 | (((bVar3 && bVar4) && bVar2) && bVar1);
    x6.n[0] = 0;
    x6.n[1] = 0;
    x6.n[2] = 0;
    x6.n[3] = 0;
    stack0xfffffffffffc9e68 = (undefined1  [16])0x0;
    uStack_36078 = 0;
    bStack_36071 = 0;
    uStack_36070 = 0;
    uStack_3606c = 0;
    uStack_3606a = 0;
    bStack_36069 = 0;
    uStack_36088 = 0;
    uStack_36080 = 0;
    bStack_36079 = 0;
    psVar20 = &sStack_36108;
    psVar28 = &nums_ge;
    for (lVar13 = 0x10; lVar13 != 0; lVar13 = lVar13 + -1) {
      (psVar28->x).n[0] = (psVar20->x).n[0];
      psVar20 = (secp256k1_gej *)((long)psVar20 + ((ulong)bVar40 * -2 + 1) * 8);
      psVar28 = (secp256k1_ge *)((long)psVar28 + (ulong)bVar40 * -0x10 + 8);
    }
    uVar30 = uVar29 + 1;
    uVar12 = (ulong)(0xfffffffffffffffe < uVar29);
    uVar33 = uVar32 + uVar12;
    uVar12 = (ulong)CARRY8(uVar32,uVar12);
    uVar24 = uVar27 + uVar12;
    uVar12 = (ulong)CARRY8(uVar27,uVar12);
    lVar13 = uVar11 + uVar12;
    uVar10 = (uint)((0xbaaedce6af48a03a < uVar33 && 0xfffffffffffffffd < uVar24) && lVar13 == -1);
    uVar9 = 0;
    if (0xbaaedce6af48a03b < uVar33) {
      uVar9 = uVar10;
    }
    if (uVar30 < 0xbfd25e8cd0364141) {
      uVar10 = 0;
    }
    uVar27 = 0;
    uVar29 = (ulong)((uVar10 | uVar9 | (uVar24 == 0xffffffffffffffff && lVar13 == -1)) +
                    (uint)CARRY8(uVar11,uVar12));
    uVar11 = (ulong)CARRY8(uVar29 * 0x402da1732fc9bebf,uVar30);
    uVar12 = uVar29 * 0x4551231950b75fc4 + uVar33;
    auStack_362e0[0] = uVar29 * 0x402da1732fc9bebf + uVar30;
    auStack_362e0[1] = uVar12 + uVar11;
    uVar11 = (ulong)(CARRY8(uVar29 * 0x4551231950b75fc4,uVar33) || CARRY8(uVar12,uVar11));
    auStack_362e0[2] = uVar24 + uVar29 + uVar11;
    auStack_362e0[3] = lVar13 + (ulong)(CARRY8(uVar24,uVar29) || CARRY8(uVar24 + uVar29,uVar11));
    lVar13 = 0x38;
    uStack_36340 = 0;
    uStack_36348 = 0;
    uStack_36350 = 0;
    uStack_36358 = 0;
    uStack_36360 = 0;
    uStack_36368 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      uVar24 = 0;
      do {
        if (((uint)(auStack_362e0[uVar27 >> 4 & 0xfffffff] >> ((char)uVar27 * '\x04' & 0x3fU)) & 0xf
            ) << 6 == uVar24) {
          uVar11 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x38);
          uVar12 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x30);
          uStack_36368 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x28);
          uStack_36360 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x20);
          uStack_36358 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x18);
          uStack_36350 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -0x10);
          uStack_36348 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13 + -8);
          uStack_36340 = *(ulong *)((long)pvStack_366b8 + uVar24 + lVar13);
        }
        uVar24 = uVar24 + 0x40;
      } while (uVar24 != 0x400);
      x3.n[0] = uVar11 & 0xfffffffffffff;
      x3.n[1] = (uVar12 & 0xffffffffff) << 0xc | uVar11 >> 0x34;
      x3.n[2] = (uStack_36368 & 0xfffffff) << 0x18 | uVar12 >> 0x28;
      x3.n[3] = (uStack_36360 & 0xffff) << 0x24 | uStack_36368 >> 0x1c;
      x3.n[4] = uStack_36360 >> 0x10;
      sStack_36590.n[0] = uStack_36358 & 0xfffffffffffff;
      sStack_36590.n[1] = (uStack_36350 & 0xffffffffff) << 0xc | uStack_36358 >> 0x34;
      sStack_36590.n[2] = (uStack_36348 & 0xfffffff) << 0x18 | uStack_36350 >> 0x28;
      sStack_36590.n[3] = (uStack_36340 & 0xffff) << 0x24 | uStack_36348 >> 0x1c;
      sStack_36590.n[4] = uStack_36340 >> 0x10;
      uStack_36568 = uStack_36568 & 0xffffffff00000000;
      uStack_363c8 = x3.n[3];
      uStack_363c0 = x3.n[2];
      uStack_363b8 = x3.n[0];
      uStack_363b0 = x3.n[1];
      uStack_363a8 = x3.n[4];
      uStack_363a0 = sStack_36590.n[4];
      uStack_36398 = sStack_36590.n[3];
      uStack_36390 = sStack_36590.n[2];
      uStack_36388 = sStack_36590.n[1];
      uStack_36380 = sStack_36590.n[0];
      secp256k1_fe_sqr(&x44,(secp256k1_fe *)&nums_ge.infinity);
      uVar38 = (nums_ge.x.n[4] >> 0x30) * 0x1000003d1 + nums_ge.x.n[0];
      uVar24 = (uVar38 >> 0x34) + nums_ge.x.n[1];
      uVar18 = (uVar24 >> 0x34) + nums_ge.x.n[2];
      uVar38 = uVar38 & 0xfffffffffffff;
      x88.n[1] = uVar24 & 0xfffffffffffff;
      uVar16 = (uVar18 >> 0x34) + nums_ge.x.n[3];
      uVar18 = uVar18 & 0xfffffffffffff;
      uVar19 = (uVar16 >> 0x34) + (nums_ge.x.n[4] & 0xffffffffffff);
      uVar16 = uVar16 & 0xfffffffffffff;
      x88.n[0] = uVar38;
      x88.n[2] = uVar18;
      x88.n[3] = uVar16;
      x88.n[4] = uVar19;
      uStack_363d0 = x88.n[1];
      uStack_36378 = uVar11;
      secp256k1_fe_mul(&x176,&x3,&x44);
      uVar11 = nums_ge.y.n[4] & 0xffffffffffff;
      uVar30 = (nums_ge.y.n[4] >> 0x30) * 0x1000003d1 + nums_ge.y.n[0];
      uVar33 = (uVar30 >> 0x34) + nums_ge.y.n[1];
      uVar24 = (uVar33 >> 0x34) + nums_ge.y.n[2];
      uVar29 = (uVar24 >> 0x34) + nums_ge.y.n[3];
      uStack_36370 = uVar12;
      secp256k1_fe_mul(&x2,&sStack_36590,&x44);
      secp256k1_fe_mul(&x2,&x2,(secp256k1_fe *)&nums_ge.infinity);
      uVar17 = x176.n[4];
      uStack_363e8 = x176.n[0];
      uStack_363e0 = x176.n[1];
      uStack_363f8 = x176.n[2];
      uStack_363f0 = x176.n[3];
      h2.n[0] = x88.n[0] + x176.n[0];
      h2.n[1] = x88.n[1] + x176.n[1];
      h2.n[2] = x88.n[2] + x176.n[2];
      h2.n[3] = x88.n[3] + x176.n[3];
      h2.n[4] = x88.n[4] + x176.n[4];
      lVar14 = (uVar29 >> 0x34) + uVar11;
      uStack_36278 = uVar24 & 0xfffffffffffff;
      uStack_36270 = uVar29 & 0xfffffffffffff;
      uStack_36268 = uVar30 & 0xfffffffffffff;
      uStack_36260 = uVar33 & 0xfffffffffffff;
      uVar24 = uStack_36268 + x2.n[0];
      uVar30 = uStack_36260 + x2.n[1];
      uVar33 = uStack_36278 + x2.n[2];
      uVar29 = uStack_36270 + x2.n[3];
      uVar32 = x2.n[4] + lVar14;
      secp256k1_fe_sqr(&sStack_36338,&h2);
      sStack_36428.n[0] = 0x3ffffbfffff0bc - uStack_363e8;
      sStack_36428.n[1] = 0x3ffffffffffffc - uStack_363e0;
      sStack_36428.n[2] = 0x3ffffffffffffc - uStack_363f8;
      sStack_36428.n[3] = 0x3ffffffffffffc - uStack_363f0;
      sStack_36428.n[4] = 0x3fffffffffffc - uVar17;
      uStack_36298 = sStack_36428.n[0];
      uStack_36290 = sStack_36428.n[1];
      uStack_36288 = sStack_36428.n[2];
      uStack_36280 = sStack_36428.n[3];
      secp256k1_fe_mul(&x176_1,&x88,&sStack_36428);
      uStack_363e8 = sStack_36338.n[0] + x176_1.n[0];
      uStack_363e0 = sStack_36338.n[1] + x176_1.n[1];
      uStack_363f8 = sStack_36338.n[2] + x176_1.n[2];
      uStack_363f0 = sStack_36338.n[3] + x176_1.n[3];
      uVar35 = sStack_36338.n[4] + x176_1.n[4];
      sStack_36338.n[0] = uStack_363e8;
      sStack_36338.n[1] = uStack_363e0;
      sStack_36338.n[2] = uStack_363f8;
      sStack_36338.n[3] = uStack_363f0;
      sStack_36338.n[4] = uVar35;
      uVar9 = secp256k1_fe_normalizes_to_zero(&sStack_36338);
      uVar38 = uStack_36298 + uVar38;
      uVar21 = uStack_36290 + uStack_363d0;
      uVar18 = uStack_36288 + uVar18;
      uVar16 = uStack_36280 + uVar16;
      sStack_36538.n[0] = uVar24;
      sStack_36538.n[1] = uVar30;
      sStack_36538.n[2] = uVar33;
      sStack_36538.n[3] = uVar29;
      sStack_36538.n[4] = uVar32;
      uVar10 = secp256k1_fe_normalizes_to_zero(&sStack_36538);
      uVar10 = uVar10 & uVar9;
      auVar43._8_8_ = uStack_36260 * 2;
      auVar43._0_8_ = uStack_36268 * 2;
      auVar45._8_8_ = uStack_36270 * 2;
      auVar45._0_8_ = uStack_36278 * 2;
      uVar11 = (ulong)(uVar10 ^ 1) - 1;
      uVar12 = -(ulong)(uVar10 ^ 1);
      auVar41._8_4_ = (int)uVar11;
      auVar41._0_8_ = uVar11;
      auVar41._12_4_ = (int)(uVar11 >> 0x20);
      auVar42._8_4_ = (int)uVar12;
      auVar42._0_8_ = uVar12;
      auVar42._12_4_ = (int)(uVar12 >> 0x20);
      auVar6._8_8_ = uStack_363f0;
      auVar6._0_8_ = uStack_363f8;
      auStack_36220 = auVar6 & auVar42 | auVar45 & auVar41;
      auVar7._8_8_ = uStack_363e0;
      auVar7._0_8_ = uStack_363e8;
      auStack_36230 = auVar7 & auVar42 | auVar43 & auVar41;
      uStack_36210 = uVar35 & uVar12 | lVar14 * 2 & uVar11;
      sStack_36428.n[0] = uVar24 & uVar12 | uVar38 & uVar11;
      sStack_36428.n[1] = uVar30 & uVar12 | uVar21 & uVar11;
      sStack_36428.n[2] = uVar33 & uVar12 | uVar18 & uVar11;
      sStack_36428.n[3] = uVar29 & uVar12 | uVar16 & uVar11;
      sStack_36428.n[4] = uVar12 & uVar32 | (0x3fffffffffffc - uVar17) + uVar19 & uVar11;
      secp256k1_fe_sqr(&nums_x,&sStack_36428);
      secp256k1_fe_mul(&sStack_362c0,&nums_x,&h2);
      secp256k1_fe_sqr(&nums_x,&nums_x);
      uVar11 = (ulong)uVar10 - 1;
      uVar39 = -(ulong)uVar10;
      uVar18 = nums_x.n[0] & uVar11;
      uVar16 = nums_x.n[1] & uVar11;
      uVar21 = nums_x.n[2] & uVar11;
      uVar35 = nums_x.n[3] & uVar11;
      uVar11 = uVar11 & nums_x.n[4];
      secp256k1_fe_sqr(&h2,(secp256k1_fe *)auStack_36230);
      piVar36 = &nums_ge.infinity;
      secp256k1_fe_mul((secp256k1_fe *)piVar36,(secp256k1_fe *)piVar36,&sStack_36428);
      iVar22 = secp256k1_fe_normalizes_to_zero((secp256k1_fe *)piVar36);
      lVar14 = (long)(int)uStack_35fc0;
      uStack_35fc0 = (1 - uStack_35fc0) * iVar22;
      uVar34 = h2.n[4] + (0x3fffffffffffc - sStack_362c0.n[4]);
      uVar12 = (uVar34 >> 0x30) * 0x1000003d1 + h2.n[0] + (0x3ffffbfffff0bc - sStack_362c0.n[0]);
      uVar38 = (uVar12 >> 0x34) + h2.n[1] + (0x3ffffffffffffc - sStack_362c0.n[1]);
      nums_ge.x.n[0] = uVar12 & 0xfffffffffffff;
      uVar31 = (uVar38 >> 0x34) + h2.n[2] + (0x3ffffffffffffc - sStack_362c0.n[2]);
      nums_ge.x.n[1] = uVar38 & 0xfffffffffffff;
      uVar12 = (uVar31 >> 0x34) + h2.n[3] + (0x3ffffffffffffc - sStack_362c0.n[3]);
      nums_ge.x.n[2] = uVar31 & 0xfffffffffffff;
      nums_ge.x.n[4] = (uVar12 >> 0x34) + (uVar34 & 0xffffffffffff);
      nums_ge.x.n[3] = uVar12 & 0xfffffffffffff;
      h2.n[0] = (0x3ffffbfffff0bc - sStack_362c0.n[0]) + nums_ge.x.n[0] * 2;
      h2.n[1] = (0x3ffffffffffffc - sStack_362c0.n[1]) + nums_ge.x.n[1] * 2;
      h2.n[2] = (0x3ffffffffffffc - sStack_362c0.n[2]) + nums_ge.x.n[2] * 2;
      h2.n[3] = (0x3ffffffffffffc - sStack_362c0.n[3]) + nums_ge.x.n[3] * 2;
      h2.n[4] = (0x3fffffffffffc - sStack_362c0.n[4]) + nums_ge.x.n[4] * 2;
      uVar12 = nums_ge._80_8_ * 2;
      secp256k1_fe_mul(&h2,&h2,(secp256k1_fe *)auStack_36230);
      uVar38 = 0x7fffffffffff8 - ((uVar39 & uVar32 | uVar11) + h2.n[4]);
      uVar24 = ((uVar38 >> 0x30) * 0x1000003d1 - ((uVar24 & uVar39 | uVar18) + h2.n[0])) +
               0x7ffff7ffffe178;
      uVar30 = ((uVar24 >> 0x34) - ((uVar30 & uVar39 | uVar16) + h2.n[1])) + 0x7ffffffffffff8;
      uVar33 = ((uVar30 >> 0x34) - ((uVar33 & uVar39 | uVar21) + h2.n[2])) + 0x7ffffffffffff8;
      uVar32 = ((uVar33 >> 0x34) - ((uVar29 & uVar39 | uVar35) + h2.n[3])) + 0x7ffffffffffff8;
      uVar11 = lVar14 - 1;
      uVar29 = -lVar14;
      nums_ge.x.n[0] = uStack_363b8 & uVar29 | nums_ge.x.n[0] << 2 & uVar11;
      nums_ge.x.n[1] = uStack_363b0 & uVar29 | nums_ge.x.n[1] << 2 & uVar11;
      nums_ge.x.n[2] = uStack_363c0 & uVar29 | nums_ge.x.n[2] << 2 & uVar11;
      nums_ge.x.n[3] = uStack_363c8 & uVar29 | nums_ge.x.n[3] << 2 & uVar11;
      nums_ge.x.n[4] = uStack_363a8 & uVar29 | nums_ge.x.n[4] << 2 & uVar11;
      uVar18 = uVar11 & 0x3ffffffffffffc;
      nums_ge.y.n[0] = uStack_36380 & uVar29 | uVar24 * 4 & uVar18;
      nums_ge.y.n[1] = uStack_36388 & uVar29 | uVar30 * 4 & uVar18;
      nums_ge.y.n[2] = uStack_36390 & uVar29 | uVar33 * 4 & uVar18;
      nums_ge.y.n[3] = uStack_36398 & uVar29 | uVar18 & uVar32 * 4;
      nums_ge.y.n[4] =
           uStack_363a0 & uVar29 | ((uVar32 >> 0x34) + (uVar38 & 0xffffffffffff)) * 4 & uVar11;
      nums_ge._80_8_ = (ulong)((uint)uVar29 & 1) | uVar12 & uVar11;
      uVar27 = uVar27 + 1;
      lVar13 = lVar13 + 0x400;
      uVar12 = uStack_36370;
      uVar11 = uStack_36378;
    } while (uVar27 != 0x40);
    lStack_366c0 = 0;
    while( true ) {
      fwrite("{\n",2,1,__s);
      for (lVar13 = 0x38; uVar11 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x20),
          uVar12 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x28),
          uVar24 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x38),
          uVar27 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x30),
          uVar30 = *(ulong *)((long)pvStack_366b8 + lVar13 + -8),
          uVar33 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x10),
          uVar29 = *(ulong *)((long)pvStack_366b8 + lVar13 + -0x18),
          fprintf(__s,
                  "    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)"
                  ,uVar11 >> 0x20,uVar11,uVar12 >> 0x20,uVar12,uVar27 >> 0x20,uVar27,uVar24 >> 0x20,
                  uVar24,*(ulong *)((long)pvStack_366b8 + lVar13) >> 0x20,
                  *(ulong *)((long)pvStack_366b8 + lVar13),uVar30 >> 0x20,uVar30,uVar33 >> 0x20,
                  uVar33,uVar29 >> 0x20,uVar29), lVar13 != 0x3f8; lVar13 = lVar13 + 0x40) {
        fwrite(",\n",2,1,__s);
      }
      fputc(10,__s);
      if (lStack_366c0 == 0x3f) break;
      fwrite("},\n",3,1,__s);
      lStack_366c0 = lStack_366c0 + 1;
      pvStack_366b8 = (void *)((long)pvStack_366b8 + 0x400);
    }
    fwrite("}\n",2,1,__s);
    fwrite("};\n",3,1,__s);
    free(pvStack_363d8);
    fwrite("#undef SC\n",10,1,__s);
    fwrite("#endif\n",7,1,__s);
    fclose(__s);
    iVar22 = 0;
  }
  return iVar22;
}

Assistant:

int main(int argc, char **argv) {
    secp256k1_ecmult_gen_context ctx;
    void *prealloc, *base;
    int inner;
    int outer;
    FILE* fp;

    (void)argc;
    (void)argv;

    fp = fopen("src/ecmult_static_context.h","w");
    if (fp == NULL) {
        fprintf(stderr, "Could not open src/ecmult_static_context.h for writing!\n");
        return -1;
    }

    fprintf(fp, "#ifndef _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#define _SECP256K1_ECMULT_STATIC_CONTEXT_\n");
    fprintf(fp, "#include \"src/group.h\"\n");
    fprintf(fp, "#define SC SECP256K1_GE_STORAGE_CONST\n");
    fprintf(fp, "#if ECMULT_GEN_PREC_N != %d || ECMULT_GEN_PREC_G != %d\n", ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G);
    fprintf(fp, "   #error configuration mismatch, invalid ECMULT_GEN_PREC_N, ECMULT_GEN_PREC_G. Try deleting ecmult_static_context.h before the build.\n");
    fprintf(fp, "#endif\n");
    fprintf(fp, "static const secp256k1_ge_storage secp256k1_ecmult_static_context[ECMULT_GEN_PREC_N][ECMULT_GEN_PREC_G] = {\n");

    base = checked_malloc(&default_error_callback, SECP256K1_ECMULT_GEN_CONTEXT_PREALLOCATED_SIZE);
    prealloc = base;
    secp256k1_ecmult_gen_context_init(&ctx);
    secp256k1_ecmult_gen_context_build(&ctx, &prealloc);
    for(outer = 0; outer != ECMULT_GEN_PREC_N; outer++) {
        fprintf(fp,"{\n");
        for(inner = 0; inner != ECMULT_GEN_PREC_G; inner++) {
            fprintf(fp,"    SC(%uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu, %uu)", SECP256K1_GE_STORAGE_CONST_GET((*ctx.prec)[outer][inner]));
            if (inner != ECMULT_GEN_PREC_G - 1) {
                fprintf(fp,",\n");
            } else {
                fprintf(fp,"\n");
            }
        }
        if (outer != ECMULT_GEN_PREC_N - 1) {
            fprintf(fp,"},\n");
        } else {
            fprintf(fp,"}\n");
        }
    }
    fprintf(fp,"};\n");
    secp256k1_ecmult_gen_context_clear(&ctx);
    free(base);

    fprintf(fp, "#undef SC\n");
    fprintf(fp, "#endif\n");
    fclose(fp);

    return 0;
}